

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsInputOutput.cpp
# Opt level: O3

void chrono::utils::WriteVisualizationAssets
               (ChSystem *system,string *filename,function<bool_(const_chrono::ChBody_&)> *selector,
               bool body_info,string *delim)

{
  ChBody *pCVar1;
  long *plVar2;
  pointer psVar3;
  element_type *peVar4;
  ChFrameMoving<double> *pCVar5;
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar15;
  undefined4 extraout_var_01;
  long lVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  long lVar18;
  ChPhysicsItem *this;
  undefined8 uVar19;
  undefined7 in_register_00000009;
  pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_> *shape_instance;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int *p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  pointer psVar22;
  _func_int *p_Var23;
  float fVar24;
  pointer_____offset_0x10___ *unaff_R14;
  ostringstream *poVar25;
  pointer psVar26;
  CSV_writer csv;
  ChFrame<double> X_GS;
  stringstream header;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_470;
  int local_454;
  int local_43c;
  undefined1 local_438 [16];
  double local_428 [3];
  _Any_data *local_410;
  float local_408;
  undefined4 uStack_404;
  undefined8 uStack_400;
  pointer local_3f8;
  pointer local_3f0;
  ChSystem *local_3e8;
  CSV_writer local_3e0;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_238;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_200;
  double local_1e8;
  double local_1d0;
  string *local_1c0;
  undefined1 local_1b8 [128];
  pointer local_138;
  
  local_410 = (_Any_data *)selector;
  local_3e8 = system;
  local_1c0 = filename;
  CSV_writer::CSV_writer(&local_3e0,delim);
  iVar8 = 0;
  local_43c = 0;
  if ((int)CONCAT71(in_register_00000009,body_info) != 0) {
    local_43c = 0;
    unaff_R14 = (pointer_____offset_0x10___ *)
                (local_3e8->assembly).bodylist.
                super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (local_3e8->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_408 = SUB84(p_Var21,0);
    uStack_404 = (undefined4)((ulong)p_Var21 >> 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 != p_Var21) {
      local_43c = 0;
      do {
        pCVar1 = (ChBody *)
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_vptr__Sp_counted_base
        ;
        p_Var21 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          }
        }
        if (*(long *)(local_410 + 1) == 0) goto LAB_0091feac;
        bVar13 = (**(code **)((long)local_410 + 0x18))(local_410,pCVar1);
        if (bVar13) {
          iVar14 = (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar1);
          lVar18 = CONCAT44(extraout_var,iVar14);
          iVar14 = (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar1);
          lVar16 = CONCAT44(extraout_var_00,iVar14);
          poVar15 = (ostream *)
                    std::ostream::operator<<
                              (&local_3e0.m_ss,
                               (pCVar1->super_ChPhysicsItem).super_ChObj.m_identifier);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])(pCVar1);
          bVar13 = SUB81(&local_3e0.m_ss,0);
          poVar15 = std::ostream::_M_insert<bool>(bVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0x18));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x20));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x28));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + bVar13);
          std::ostream::put(bVar13);
          std::ostream::flush();
          local_43c = local_43c + 1;
        }
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
        unaff_R14 = (pointer_____offset_0x10___ *)((long)unaff_R14 + 0x10);
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_404,local_408));
    }
  }
  psVar26 = (local_3e8->assembly).bodylist.
            super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3f8 = (local_3e8->assembly).bodylist.
              super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar26 != local_3f8) {
    poVar25 = &local_3e0.m_ss;
    iVar8 = 0;
    do {
      pCVar1 = (psVar26->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var21 = (psVar26->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
        }
      }
      if (*(long *)(local_410 + 1) == 0) {
        std::__throw_bad_function_call();
        local_470 = p_Var21;
LAB_0091feac:
        uVar19 = std::__throw_bad_function_call();
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14);
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14);
        }
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base((ios_base *)&local_138);
        if (local_470 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470);
        }
        CSV_writer::~CSV_writer(&local_3e0);
        _Unwind_Resume(uVar19);
      }
      bVar13 = (**(code **)((long)local_410 + 0x18))(local_410,pCVar1);
      local_3f0 = psVar26;
      if (bVar13) {
        ChPhysicsItem::GetVisualModel(&pCVar1->super_ChPhysicsItem);
        uVar19 = local_1b8._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
        }
        if ((_func_int **)uVar19 != (_func_int **)0x0) {
          ChPhysicsItem::GetVisualModel(&pCVar1->super_ChPhysicsItem);
          uVar19 = local_1b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          p_Var20 = *(_func_int **)(uVar19 + 8);
          for (p_Var23 = *(_func_int **)uVar19; p_Var23 != p_Var20; p_Var23 = p_Var23 + 0x98) {
            iVar14 = (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(pCVar1);
            chrono::operator*((ChFrame<double> *)local_248,
                              (ChFrameMoving<double> *)CONCAT44(extraout_var_01,iVar14),
                              (ChFrame<double> *)(p_Var23 + 0x10));
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            lVar18 = *(long *)p_Var23;
            if (lVar18 == 0) goto LAB_0091e45d;
            unaff_R14 = &ChVisualShape::typeinfo;
            lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChSphereShape::typeinfo);
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14;
            if (lVar16 == 0) {
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChEllipsoidShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x40));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChBoxShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,2);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x40));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChCapsuleShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,7);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChCylinderShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x60));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x40));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x48));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x50));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x58));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChConeShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x48));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x50));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChRoundedBoxShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x40));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x48));
                goto LAB_0091e141;
              }
              lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,
                                      &ChRoundedCylinderShape::typeinfo);
              if (lVar16 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x38));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x40));
                goto LAB_0091e141;
              }
              p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        __dynamic_cast(lVar18,&ChVisualShape::typeinfo,
                                       &ChTriangleMeshShape::typeinfo);
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,5);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
                lVar18._0_4_ = p_Var17[4]._M_use_count;
                lVar18._4_4_ = p_Var17[4]._M_weak_count;
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar15,(char *)p_Var17[4]._vptr__Sp_counted_base,lVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
                goto LAB_0091e141;
              }
              lVar18 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChLineShape::typeinfo);
              if (lVar18 != 0) {
                this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    this_00->_M_use_count = this_00->_M_use_count + 1;
                  }
                }
                lVar16 = *(long *)(lVar18 + 0x28);
                unaff_R14 = *(pointer_____offset_0x10___ **)(lVar18 + 0x30);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count +
                         1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count +
                         1;
                  }
                }
                if ((lVar16 == 0) ||
                   (lVar16 = __dynamic_cast(lVar16,&geometry::ChLine::typeinfo,
                                            &geometry::ChLineBezier::typeinfo), lVar16 == 0)) {
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 ==
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                    }
                    goto LAB_0091e45d;
                  }
                  bVar13 = false;
                }
                else {
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count
                           + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14)->_M_use_count
                           + 1;
                    }
                  }
                  poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,0xc);
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
                  local_408 = SUB84(poVar15,0);
                  uStack_404 = (undefined4)((ulong)poVar15 >> 0x20);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)CONCAT44(uStack_404,local_408),
                                       *(char **)(lVar18 + 0x38),*(long *)(lVar18 + 0x40));
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"",1);
                  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14 ==
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0091e141;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14);
                  bVar13 = true;
                  iVar8 = iVar8 + 1;
                }
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unaff_R14);
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
                if (!bVar13) goto LAB_0091e45d;
                goto LAB_0091e14e;
              }
            }
            else {
              this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var23 + 8);
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
              std::ostream::_M_insert<double>(*(double *)(lVar16 + 0x30));
LAB_0091e141:
              iVar8 = iVar8 + 1;
              unaff_R14 = (pointer_____offset_0x10___ *)p_Var17;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
LAB_0091e14e:
              ChVisualMaterial::Default();
              fVar24 = *(float *)(local_438._0_8_ + 0x14);
              local_408 = (float)*(undefined8 *)(local_438._0_8_ + 0xc);
              uStack_404 = (undefined4)((ulong)*(undefined8 *)(local_438._0_8_ + 0xc) >> 0x20);
              uStack_400 = 0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_);
              }
              plVar2 = *(long **)(*(long *)p_Var23 + 0x10);
              if (0 < (int)((ulong)(*(long *)(*(long *)p_Var23 + 0x18) - (long)plVar2) >> 4)) {
                lVar18 = *plVar2;
                p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar2[1];
                if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  fVar24 = *(float *)(lVar18 + 0x14);
                  local_408 = (float)*(undefined8 *)(lVar18 + 0xc);
                  uStack_404 = (undefined4)((ulong)*(undefined8 *)(lVar18 + 0xc) >> 0x20);
                  uStack_400 = 0;
                }
                else {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  }
                  fVar24 = *(float *)(lVar18 + 0x14);
                  local_408 = (float)*(undefined8 *)(lVar18 + 0xc);
                  uStack_404 = (undefined4)((ulong)*(undefined8 *)(lVar18 + 0xc) >> 0x20);
                  uStack_400 = 0;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                }
              }
              poVar15 = (ostream *)
                        std::ostream::operator<<
                                  (poVar25,(pCVar1->super_ChPhysicsItem).super_ChObj.m_identifier);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              (*(pCVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])(pCVar1);
              bVar13 = SUB81(poVar25,0);
              poVar15 = std::ostream::_M_insert<bool>(bVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)local_248._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)aStack_238._M_allocated_capacity);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)aStack_238._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>(local_228);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>(local_220);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>(local_218);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>(local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)local_408);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              auVar6._4_4_ = uStack_404;
              auVar6._0_4_ = local_408;
              auVar6._8_8_ = uStack_400;
              auVar6 = vmovshdup_avx(auVar6);
              poVar15 = std::ostream::_M_insert<double>((double)auVar6._0_4_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)fVar24);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              std::__cxx11::stringbuf::str();
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar25,(char *)local_438._0_8_,local_438._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + bVar13);
              std::ostream::put(bVar13);
              std::ostream::flush();
              if ((double *)local_438._0_8_ != local_428) {
                operator_delete((void *)local_438._0_8_,(long)local_428[0] + 1);
              }
            }
LAB_0091e45d:
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)&local_138);
          }
        }
      }
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
      }
      psVar26 = local_3f0 + 1;
    } while (psVar26 != local_3f8);
  }
  psVar22 = (local_3e8->assembly).linklist.
            super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (local_3e8->assembly).linklist.
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_408 = SUB84(psVar3,0);
  uStack_404 = (undefined4)((ulong)psVar3 >> 0x20);
  if (psVar22 == psVar3) {
    local_454 = 0;
  }
  else {
    local_454 = 0;
    do {
      poVar25 = &local_3e0.m_ss;
      peVar4 = (psVar22->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var21 = (psVar22->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
        }
      }
      if (peVar4 == (element_type *)0x0) {
LAB_0091f544:
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0091f880;
      }
      else {
        lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkLockRevolute::typeinfo);
        if (lVar18 == 0) {
          lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkLockSpherical::typeinfo);
          if (lVar18 == 0) {
            lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkLockPrismatic::typeinfo);
            if (lVar18 == 0) {
              lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkLockCylindrical::typeinfo)
              ;
              if (lVar18 == 0) {
                lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkUniversal::typeinfo);
                cVar7 = (char)poVar25;
                if (lVar18 == 0) {
                  lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkTSDA::typeinfo);
                  if (lVar18 == 0) {
                    lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkDistance::typeinfo);
                    if (lVar18 == 0) {
                      lVar18 = __dynamic_cast(peVar4,&ChLinkBase::typeinfo,
                                              &ChLinkRevoluteSpherical::typeinfo);
                      if (lVar18 == 0) goto LAB_0091f544;
                      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                        }
                      }
                      poVar15 = (ostream *)std::ostream::operator<<(poVar25,9);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar18 + 0xb8),
                                 (ChVector<double> *)(*(long *)(lVar18 + 0x78) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar18 + 0x78) + 0x40));
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar18 + 0xd0),
                                 (ChVector<double> *)(*(long *)(lVar18 + 0x80) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar18 + 0x80) + 0x40));
                      poVar15 = std::ostream::_M_insert<double>((double)local_248._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_248._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>
                                          ((double)aStack_238._M_allocated_capacity);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                      std::ostream::put(cVar7);
                      std::ostream::flush();
                    }
                    else {
                      if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                        }
                      }
                      poVar15 = (ostream *)std::ostream::operator<<(poVar25,4);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar18 + 200),
                                 (ChVector<double> *)(*(long *)(lVar18 + 0x78) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar18 + 0x78) + 0x40));
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      ChTransform<double>::TransformLocalToParent
                                ((ChVector<double> *)(lVar18 + 0xe0),
                                 (ChVector<double> *)(*(long *)(lVar18 + 0x80) + 8),
                                 (ChMatrix33<double> *)(*(long *)(lVar18 + 0x80) + 0x40));
                      poVar15 = std::ostream::_M_insert<double>((double)local_248._0_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>((double)local_248._8_8_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      poVar15 = std::ostream::_M_insert<double>
                                          ((double)aStack_238._M_allocated_capacity);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                                 local_3e0.m_delim._M_string_length);
                      std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                      std::ostream::put(cVar7);
                      std::ostream::flush();
                    }
                  }
                  else {
                    if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                      }
                    }
                    poVar15 = (ostream *)std::ostream::operator<<(poVar25,7);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0xe8));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0xf0));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0xf8));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0x100));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0x108));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    poVar15 = std::ostream::_M_insert<double>(*(double *)(lVar18 + 0x110));
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                               local_3e0.m_delim._M_string_length);
                    std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                    std::ostream::put(cVar7);
                    std::ostream::flush();
                  }
                }
                else {
                  if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                    }
                  }
                  ChFrame<double>::operator>>
                            ((ChFrame<double> *)local_1b8,(ChFrame<double> *)(lVar18 + 0xb8),
                             *(ChFrame<double> **)(lVar18 + 0x78));
                  ChFrame<double>::operator>>
                            ((ChFrame<double> *)local_248,(ChFrame<double> *)(lVar18 + 0x140),
                             *(ChFrame<double> **)(lVar18 + 0x80));
                  poVar15 = (ostream *)std::ostream::operator<<(poVar25,3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)local_1b8._16_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)local_1b8._24_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  uVar11 = local_1b8._112_8_;
                  uVar19 = local_1b8._88_8_;
                  poVar15 = std::ostream::_M_insert<double>((double)local_1b8._64_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)uVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)uVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  dVar10 = local_1d0;
                  dVar9 = local_1e8;
                  poVar15 = std::ostream::_M_insert<double>(local_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>(dVar9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>(dVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                  std::ostream::put(cVar7);
                  std::ostream::flush();
                }
              }
              else {
                if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                  }
                }
                pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x78);
                lVar16 = *(long *)(lVar18 + 0xb8);
                local_428[0] = 0.0;
                local_248._0_8_ = (_func_int **)0x3ff0000000000000;
                local_438 = ZEXT816(0);
                aStack_238._8_8_ = 0.0;
                stack0xfffffffffffffdc0 = ZEXT816(0);
                ChFrameMoving<double>::ChFrameMoving
                          ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                           (ChQuaternion<double> *)local_248);
                ChFrameMoving<double>::TransformLocalToParent
                          (pCVar5,(ChFrameMoving<double> *)(lVar16 + 0x38),
                           (ChFrameMoving<double> *)local_1b8);
                uVar12 = local_1b8._24_8_;
                uVar11 = local_1b8._16_8_;
                uVar19 = local_1b8._8_8_;
                pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x80);
                lVar18 = *(long *)(lVar18 + 0xc0);
                local_428[0] = 0.0;
                local_248._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x3ff0000000000000;
                aStack_238._8_8_ = 0.0;
                local_3f0 = (pointer)local_1b8._80_8_;
                local_410 = (_Any_data *)local_1b8._104_8_;
                local_3f8 = local_138;
                local_438 = ZEXT816(0) << 0x20;
                unique0x100035cf = local_438;
                ChFrameMoving<double>::ChFrameMoving
                          ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                           (ChQuaternion<double> *)local_248);
                ChFrameMoving<double>::TransformLocalToParent
                          (pCVar5,(ChFrameMoving<double> *)(lVar18 + 0x38),
                           (ChFrameMoving<double> *)local_1b8);
                poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)uVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)uVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)uVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)local_3f0);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)local_410);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                poVar15 = std::ostream::_M_insert<double>((double)local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                           local_3e0.m_delim._M_string_length);
                cVar7 = (char)&local_3e0.m_ss;
                std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                std::ostream::put(cVar7);
                std::ostream::flush();
              }
            }
            else {
              if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                }
              }
              pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x78);
              lVar16 = *(long *)(lVar18 + 0xb8);
              local_428[0] = 0.0;
              local_248._0_8_ = (_func_int **)0x3ff0000000000000;
              local_438 = ZEXT816(0);
              aStack_238._8_8_ = 0.0;
              stack0xfffffffffffffdc0 = ZEXT816(0);
              ChFrameMoving<double>::ChFrameMoving
                        ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                         (ChQuaternion<double> *)local_248);
              ChFrameMoving<double>::TransformLocalToParent
                        (pCVar5,(ChFrameMoving<double> *)(lVar16 + 0x38),
                         (ChFrameMoving<double> *)local_1b8);
              uVar12 = local_1b8._24_8_;
              uVar11 = local_1b8._16_8_;
              uVar19 = local_1b8._8_8_;
              pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x80);
              lVar18 = *(long *)(lVar18 + 0xc0);
              local_428[0] = 0.0;
              local_248._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x3ff0000000000000;
              aStack_238._8_8_ = 0.0;
              local_3f0 = (pointer)local_1b8._80_8_;
              local_410 = (_Any_data *)local_1b8._104_8_;
              local_3f8 = local_138;
              local_438 = ZEXT816(0) << 0x20;
              unique0x100035df = local_438;
              ChFrameMoving<double>::ChFrameMoving
                        ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                         (ChQuaternion<double> *)local_248);
              ChFrameMoving<double>::TransformLocalToParent
                        (pCVar5,(ChFrameMoving<double> *)(lVar18 + 0x38),
                         (ChFrameMoving<double> *)local_1b8);
              poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)uVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)uVar11);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)uVar12);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)local_3f0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)local_410);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              poVar15 = std::ostream::_M_insert<double>((double)local_3f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                         local_3e0.m_delim._M_string_length);
              cVar7 = (char)&local_3e0.m_ss;
              std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
            }
          }
          else {
            if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              }
            }
            pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x78);
            lVar16 = *(long *)(lVar18 + 0xb8);
            local_428[0] = 0.0;
            local_248._0_8_ = (_func_int **)0x3ff0000000000000;
            local_438 = ZEXT816(0);
            aStack_238._8_8_ = 0.0;
            stack0xfffffffffffffdc0 = ZEXT816(0);
            ChFrameMoving<double>::ChFrameMoving
                      ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                       (ChQuaternion<double> *)local_248);
            ChFrameMoving<double>::TransformLocalToParent
                      (pCVar5,(ChFrameMoving<double> *)(lVar16 + 0x38),
                       (ChFrameMoving<double> *)local_1b8);
            uVar12 = local_1b8._24_8_;
            uVar11 = local_1b8._16_8_;
            uVar19 = local_1b8._8_8_;
            pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x80);
            lVar18 = *(long *)(lVar18 + 0xc0);
            local_428[0] = 0.0;
            local_248._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x3ff0000000000000;
            aStack_238._8_8_ = 0.0;
            local_438 = ZEXT816(0) << 0x20;
            unique0x100035ef = local_438;
            ChFrameMoving<double>::ChFrameMoving
                      ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                       (ChQuaternion<double> *)local_248);
            ChFrameMoving<double>::TransformLocalToParent
                      (pCVar5,(ChFrameMoving<double> *)(lVar18 + 0x38),
                       (ChFrameMoving<double> *)local_1b8);
            poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length
                      );
            poVar15 = std::ostream::_M_insert<double>((double)uVar19);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length
                      );
            poVar15 = std::ostream::_M_insert<double>((double)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length
                      );
            poVar15 = std::ostream::_M_insert<double>((double)uVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length
                      );
            cVar7 = (char)&local_3e0.m_ss;
            std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
        }
        else {
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
          }
          pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x78);
          lVar16 = *(long *)(lVar18 + 0xb8);
          local_428[0] = 0.0;
          local_248._0_8_ = (_func_int **)0x3ff0000000000000;
          local_438 = ZEXT816(0);
          aStack_238._8_8_ = 0.0;
          stack0xfffffffffffffdc0 = ZEXT816(0);
          ChFrameMoving<double>::ChFrameMoving
                    ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                     (ChQuaternion<double> *)local_248);
          ChFrameMoving<double>::TransformLocalToParent
                    (pCVar5,(ChFrameMoving<double> *)(lVar16 + 0x38),
                     (ChFrameMoving<double> *)local_1b8);
          uVar12 = local_1b8._24_8_;
          uVar11 = local_1b8._16_8_;
          uVar19 = local_1b8._8_8_;
          pCVar5 = *(ChFrameMoving<double> **)(lVar18 + 0x80);
          lVar18 = *(long *)(lVar18 + 0xc0);
          local_428[0] = 0.0;
          local_248._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3ff0000000000000;
          aStack_238._8_8_ = 0.0;
          local_3f0 = (pointer)local_1b8._80_8_;
          local_410 = (_Any_data *)local_1b8._104_8_;
          local_3f8 = local_138;
          local_438 = ZEXT816(0) << 0x20;
          unique0x100035ff = local_438;
          ChFrameMoving<double>::ChFrameMoving
                    ((ChFrameMoving<double> *)local_1b8,(ChVector<double> *)local_438,
                     (ChQuaternion<double> *)local_248);
          ChFrameMoving<double>::TransformLocalToParent
                    (pCVar5,(ChFrameMoving<double> *)(lVar18 + 0x38),
                     (ChFrameMoving<double> *)local_1b8);
          poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)uVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)uVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)uVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)local_3f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          poVar15 = std::ostream::_M_insert<double>((double)local_3f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,local_3e0.m_delim._M_dataplus._M_p,local_3e0.m_delim._M_string_length);
          cVar7 = (char)&local_3e0.m_ss;
          std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
        }
        local_454 = local_454 + 1;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
LAB_0091f880:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
        }
      }
      psVar22 = psVar22 + 1;
    } while (psVar22 != (pointer)CONCAT44(uStack_404,local_408));
    psVar22 = (local_3e8->assembly).linklist.
              super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (local_3e8->assembly).linklist.
             super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar22 != psVar3) {
      local_408 = 0.0;
      uStack_404 = 0;
      do {
        p_Var21 = (psVar22->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        peVar4 = (psVar22->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
          }
        }
        if ((peVar4 == (element_type *)0x0) ||
           (this = (ChPhysicsItem *)
                   __dynamic_cast(peVar4,&ChLinkBase::typeinfo,&ChLinkTSDA::typeinfo,0),
           this == (ChPhysicsItem *)0x0)) {
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0091fd26;
        }
        else {
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var21->_M_use_count = p_Var21->_M_use_count + 1;
            }
          }
          ChPhysicsItem::GetVisualModel(this);
          uVar19 = local_1b8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          if ((_func_int **)uVar19 != (_func_int **)0x0) {
            ChPhysicsItem::GetVisualModel(this);
            uVar19 = local_1b8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
            }
            p_Var23 = *(_func_int **)(uVar19 + 8);
            for (p_Var20 = *(_func_int **)uVar19; p_Var20 != p_Var23; p_Var20 = p_Var20 + 0x98) {
              lVar18 = *(long *)p_Var20;
              if (lVar18 != 0) {
                lVar16 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChSegmentShape::typeinfo,0)
                ;
                if (lVar16 == 0) {
                  lVar18 = __dynamic_cast(lVar18,&ChVisualShape::typeinfo,&ChSpringShape::typeinfo,0
                                         );
                  if (lVar18 == 0) goto LAB_0091fd03;
                  p_Var17 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var20 + 8);
                  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    }
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                  }
                  poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>(*(double *)&this[1].offset_L);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)this[2].super_ChObj._vptr_ChObj)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name.field_2.
                                               _M_allocated_capacity);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      (*(double *)((long)&this[2].super_ChObj.m_name.field_2 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  cVar7 = (char)&local_3e0.m_ss;
                  std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                  std::ostream::put(cVar7);
                  std::ostream::flush();
                }
                else {
                  p_Var17 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var20 + 8);
                  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    }
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                  }
                  poVar15 = (ostream *)std::ostream::operator<<(&local_3e0.m_ss,0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>(*(double *)&this[1].offset_L);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>((double)this[2].super_ChObj._vptr_ChObj)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      ((double)this[2].super_ChObj.m_name.field_2.
                                               _M_allocated_capacity);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  poVar15 = std::ostream::_M_insert<double>
                                      (*(double *)((long)&this[2].super_ChObj.m_name.field_2 + 8));
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,local_3e0.m_delim._M_dataplus._M_p,
                             local_3e0.m_delim._M_string_length);
                  cVar7 = (char)&local_3e0.m_ss;
                  std::ios::widen((char)*(undefined8 *)(local_3e0._32_8_ + -0x18) + cVar7);
                  std::ostream::put(cVar7);
                  std::ostream::flush();
                }
                local_408 = (float)((int)local_408 + 1);
                uStack_404 = 0;
              }
LAB_0091fd03:
            }
          }
          if (p_Var21 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
LAB_0091fd26:
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var21);
          }
        }
        psVar22 = psVar22 + 1;
        fVar24 = local_408;
      } while (psVar22 != psVar3);
      goto LAB_0091fd5a;
    }
  }
  fVar24 = (float)0;
LAB_0091fd5a:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar15 = (ostream *)std::ostream::operator<<(local_1b8 + 0x10,local_43c);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar8);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_454);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)fVar24);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(delim->_M_dataplus)._M_p,delim->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  CSV_writer::write_to_file(&local_3e0,local_1c0,(string *)local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._0_8_ != &aStack_238) {
    operator_delete((void *)local_248._0_8_,aStack_238._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  CSV_writer::~CSV_writer(&local_3e0);
  return;
}

Assistant:

void WriteVisualizationAssets(ChSystem* system,
                              const std::string& filename,
                              std::function<bool(const ChBody&)> selector,
                              bool body_info,
                              const std::string& delim) {
    CSV_writer csv(delim);

    // If requested, Loop over all bodies and write out their position and
    // orientation.  Otherwise, body count is left at 0.
    int b_count = 0;

    if (body_info) {
        for (auto body : system->Get_bodylist()) {
            if (!selector(*body))
                continue;

            const ChVector<>& body_pos = body->GetFrame_REF_to_abs().GetPos();
            const ChQuaternion<>& body_rot = body->GetFrame_REF_to_abs().GetRot();

            csv << body->GetIdentifier() << body->IsActive() << body_pos << body_rot << std::endl;

            b_count++;
        }
    }

    // Loop over all bodies and over all their assets.
    int a_count = 0;
    for (auto body : system->Get_bodylist()) {
        if (!selector(*body))
            continue;

        if (!body->GetVisualModel())
            continue;

        // Loop over visual shapes -- write information for supported types.
        for (auto& shape_instance : body->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            auto X_GS = body->GetFrame_REF_to_abs() * shape_instance.second;
            auto& pos = X_GS.GetPos();
            auto& rot = X_GS.GetRot();

            bool supported = true;
            std::stringstream gss;

            if (auto sphere = std::dynamic_pointer_cast<ChSphereShape>(shape)) {
                gss << SPHERE << delim << sphere->GetSphereGeometry().rad;
                a_count++;
            } else if (auto ellipsoid = std::dynamic_pointer_cast<ChEllipsoidShape>(shape)) {
                const Vector& size = ellipsoid->GetEllipsoidGeometry().rad;
                gss << ELLIPSOID << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto box = std::dynamic_pointer_cast<ChBoxShape>(shape)) {
                const Vector& size = box->GetBoxGeometry().Size;
                gss << BOX << delim << size.x() << delim << size.y() << delim << size.z();
                a_count++;
            } else if (auto capsule = std::dynamic_pointer_cast<ChCapsuleShape>(shape)) {
                const geometry::ChCapsule& geom = capsule->GetCapsuleGeometry();
                gss << CAPSULE << delim << geom.rad << delim << geom.hlen;
                a_count++;
            } else if (auto cylinder = std::dynamic_pointer_cast<ChCylinderShape>(shape)) {
                const geometry::ChCylinder& geom = cylinder->GetCylinderGeometry();
                gss << CYLINDER << delim << geom.rad << delim << geom.p1.x() << delim << geom.p1.y() << delim
                    << geom.p1.z() << delim << geom.p2.x() << delim << geom.p2.y() << delim << geom.p2.z();
                a_count++;
            } else if (auto cone = std::dynamic_pointer_cast<ChConeShape>(shape)) {
                const geometry::ChCone& geom = cone->GetConeGeometry();
                gss << CONE << delim << geom.rad.x() << delim << geom.rad.y();
                a_count++;
            } else if (auto rbox = std::dynamic_pointer_cast<ChRoundedBoxShape>(shape)) {
                const geometry::ChRoundedBox& geom = rbox->GetRoundedBoxGeometry();
                gss << ROUNDEDBOX << delim << geom.Size.x() << delim << geom.Size.y() << delim << geom.Size.z() << delim
                    << geom.radsphere;
                a_count++;
            } else if (auto rcyl = std::dynamic_pointer_cast<ChRoundedCylinderShape>(shape)) {
                const geometry::ChRoundedCylinder& geom = rcyl->GetRoundedCylinderGeometry();
                gss << ROUNDEDCYL << delim << geom.rad << delim << geom.hlen << delim << geom.radsphere;
                a_count++;
            } else if (auto mesh = std::dynamic_pointer_cast<ChTriangleMeshShape>(shape)) {
                gss << TRIANGLEMESH << delim << "\"" << mesh->GetName() << "\"";
                a_count++;
            } else if (auto line = std::dynamic_pointer_cast<ChLineShape>(shape)) {
                std::shared_ptr<geometry::ChLine> geom = line->GetLineGeometry();
                if (auto bezier = std::dynamic_pointer_cast<geometry::ChLineBezier>(geom)) {
                    gss << BEZIER << delim << "\"" << line->GetName() << "\"";
                    a_count++;
                } else {
                    supported = false;
                }
            } else {
                supported = false;
            }

            if (supported) {
                ChColor col = ChVisualMaterial::Default()->GetDiffuseColor();
                if (shape->GetNumMaterials() > 0)
                    col = shape->GetMaterial(0)->GetDiffuseColor();
                csv << body->GetIdentifier() << body->IsActive() << pos << rot << col << gss.str() << std::endl;
            }
        }
    }

    // Loop over all links.  Write information on selected types of links.
    int l_count = 0;
    for (auto ilink : system->Get_linklist()) {
        if (auto linkR = std::dynamic_pointer_cast<ChLinkLockRevolute>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkR->GetMarker1()) >> *(linkR->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkR->GetMarker2()) >> *(linkR->GetBody2());

            csv << REVOLUTE << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkS = std::dynamic_pointer_cast<ChLinkLockSpherical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkS->GetMarker1()) >> *(linkS->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkS->GetMarker2()) >> *(linkS->GetBody2());

            csv << SPHERICAL << frA_abs.GetPos() << std::endl;
            l_count++;
        } else if (auto linkP = std::dynamic_pointer_cast<ChLinkLockPrismatic>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkP->GetMarker1()) >> *(linkP->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkP->GetMarker2()) >> *(linkP->GetBody2());

            csv << PRISMATIC << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkC = std::dynamic_pointer_cast<ChLinkLockCylindrical>(ilink)) {
            chrono::ChFrame<> frA_abs = *(linkC->GetMarker1()) >> *(linkC->GetBody1());
            chrono::ChFrame<> frB_abs = *(linkC->GetMarker2()) >> *(linkC->GetBody2());

            csv << CYLINDRICAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Zaxis() << std::endl;
            l_count++;
        } else if (auto linkU = std::dynamic_pointer_cast<ChLinkUniversal>(ilink)) {
            chrono::ChFrame<> frA_abs = linkU->GetFrame1Abs();
            chrono::ChFrame<> frB_abs = linkU->GetFrame2Abs();

            csv << UNIVERSAL << frA_abs.GetPos() << frA_abs.GetA().Get_A_Xaxis() << frB_abs.GetA().Get_A_Yaxis()
                << std::endl;
            l_count++;
        } else if (auto linkT = std::dynamic_pointer_cast<ChLinkTSDA>(ilink)) {
            csv << TSDA << linkT->GetPoint1Abs() << linkT->GetPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkD = std::dynamic_pointer_cast<ChLinkDistance>(ilink)) {
            csv << DISTANCE << linkD->GetEndPoint1Abs() << linkD->GetEndPoint2Abs() << std::endl;
            l_count++;
        } else if (auto linkRS = std::dynamic_pointer_cast<ChLinkRevoluteSpherical>(ilink)) {
            csv << REV_SPH << linkRS->GetPoint1Abs() << linkRS->GetPoint2Abs() << std::endl;
            l_count++;
        }
    }

    // Loop over links and write assets associated with spring-dampers.
    int la_count = 0;
    for (auto ilink : system->Get_linklist()) {
        auto link = std::dynamic_pointer_cast<ChLinkTSDA>(ilink);
        if (!link)
            continue;
        if (!link->GetVisualModel())
            continue;
        for (auto& shape_instance : link->GetVisualModel()->GetShapes()) {
            auto& shape = shape_instance.first;
            if (std::dynamic_pointer_cast<ChSegmentShape>(shape)) {
                csv << SEGMENT << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            } else if (std::dynamic_pointer_cast<ChSpringShape>(shape)) {
                csv << COIL << link->GetPoint1Abs() << link->GetPoint2Abs() << std::endl;
                la_count++;
            }
        }
    }

    // Write the output file, including a first line with number of bodies, visual
    // assets, links, and TSDA assets.
    std::stringstream header;
    header << b_count << delim << a_count << delim << l_count << delim << la_count << delim << std::endl;

    csv.write_to_file(filename, header.str());
}